

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_dnd_x.cxx
# Opt level: O2

int Fl::dnd(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Window *pFVar4;
  Fl_Window *window;
  char *pcVar5;
  char *pcVar6;
  Atom *pAVar7;
  void *xid;
  void *window_00;
  void *pvVar8;
  unsigned_long d3;
  Window d0;
  Window child;
  int dest_y;
  int dest_x;
  Window root;
  Fl_Window *local_a8;
  Window local_a0;
  uint junk3;
  Window new_window;
  void *local_70;
  undefined8 local_68;
  undefined8 local_60;
  long local_58;
  int local_48;
  int local_44;
  undefined8 local_40;
  
  local_a8 = first_window();
  pFVar4 = first_window();
  Fl_Window::cursor(pFVar4,FL_CURSOR_MOVE);
  pFVar4 = first_window();
  if (pFVar4->i == (Fl_X *)0x0) {
    d0 = 0;
  }
  else {
    d0 = pFVar4->i->xid;
  }
  fl_local_grab = grabfunc;
  XSetSelectionOwner(fl_display,fl_XdndSelection,fl_message_window);
  iVar3 = 4;
  window_00 = (void *)0x0;
  pFVar4 = (Fl_Window *)0x0;
  local_a0 = d0;
  do {
    if (pushed_ == (Fl_Widget *)0x0) {
      if (pFVar4 == (Fl_Window *)0x0) {
        if (iVar3 == 0) {
          if (window_00 != (void *)0x0) {
            new_window = CONCAT44(new_window._4_4_,4);
            local_68 = *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80)
            ;
            local_60 = 0;
            local_58 = fl_event_time + 1;
            local_48 = e_x_root;
            local_44 = e_y_root;
            local_40 = 0x200000000;
            local_70 = window_00;
            XSendEvent(fl_display,window_00,0,0,&new_window);
            local_58 = local_58 + 1;
            local_40 = CONCAT44(local_40._4_4_,0x200);
            new_window = CONCAT44(new_window._4_4_,5);
            XSendEvent(fl_display,window_00,0,0,&new_window);
          }
        }
        else {
          fl_sendClientMessage((Window)window_00,fl_XdndDrop,d0,0,fl_event_time,0,0);
        }
      }
      else {
        fl_i_own_selection[0] = '\x01';
        iVar3 = local_handle(0x17,pFVar4);
        if (iVar3 != 0) {
          paste(belowmouse_,0);
        }
      }
      fl_local_grab = (_func_int_int *)0x0;
      Fl_Window::cursor(local_a8,FL_CURSOR_DEFAULT);
      return 1;
    }
    new_window = 0;
    xid = *(void **)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80);
    pvVar8 = (void *)0x0;
    do {
      XQueryPointer(fl_display,xid,&root);
      if (xid == (void *)0x0) {
        if (pvVar8 == (void *)0x0) {
          iVar1 = dnd_aware(&root);
          if (iVar1 == 0) {
            pvVar8 = (void *)0x0;
            goto LAB_0019640b;
          }
          new_window = root;
          xid = (void *)root;
        }
        else {
LAB_0019640b:
          iVar1 = 0;
          xid = pvVar8;
        }
        window = (Fl_Window *)0x0;
        goto LAB_00196443;
      }
      new_window = (Window)xid;
      window = fl_find((Window)xid);
      if (window != (Fl_Window *)0x0) {
        iVar1 = 0;
        goto LAB_00196443;
      }
      iVar1 = dnd_aware(&new_window);
      pvVar8 = xid;
    } while (iVar1 == 0);
    window = (Fl_Window *)0x0;
LAB_00196443:
    d0 = local_a0;
    pvVar8 = window_00;
    if (xid == window_00) {
      if (pFVar4 == (Fl_Window *)0x0) {
        if (iVar3 != 0) {
LAB_00196646:
          pvVar8 = window_00;
          fl_sendClientMessage
                    ((Window)window_00,fl_XdndPosition,d0,0,(long)(e_x_root << 0x10 | e_y_root),
                     fl_event_time,fl_XdndActionCopy);
          goto LAB_0019668d;
        }
        iVar3 = 0;
        pFVar4 = (Fl_Window *)0x0;
      }
      else {
LAB_001964c2:
        pvVar8 = (void *)0x15;
        local_handle(0x15,pFVar4);
      }
    }
    else {
      if (pFVar4 == (Fl_Window *)0x0) {
        if (iVar3 != 0) {
          fl_sendClientMessage((Window)window_00,fl_XdndLeave,local_a0,0,0,0,0);
          pvVar8 = window_00;
        }
      }
      else {
        pvVar8 = (void *)0x16;
        local_handle(0x16,pFVar4);
        xid = (void *)new_window;
      }
      window_00 = xid;
      pcVar6 = fl_selection_buffer[0];
      iVar3 = iVar1;
      if (window != (Fl_Window *)0x0) {
        local_handle(0x14,window);
        pFVar4 = window;
        goto LAB_001964c2;
      }
      if (iVar1 != 0) {
        iVar2 = strncmp(fl_selection_buffer[0],"file:///",8);
        if (((((((iVar2 == 0) || (iVar2 = strncmp(pcVar6,"ftp://",6), iVar2 == 0)) ||
               (iVar2 = strncmp(pcVar6,"http://",7), iVar2 == 0)) ||
              ((iVar2 = strncmp(pcVar6,"https://",8), iVar2 == 0 ||
               (iVar2 = strncmp(pcVar6,"ipp://",6), iVar2 == 0)))) ||
             ((iVar2 = strncmp(pcVar6,"ldap:",5), iVar2 == 0 ||
              ((iVar2 = strncmp(pcVar6,"mailto:",7), iVar2 == 0 ||
               (iVar2 = strncmp(pcVar6,"news:",5), iVar2 == 0)))))) ||
            (iVar2 = strncmp(pcVar6,"smb://",6), iVar2 == 0)) &&
           (pcVar5 = strchr(pcVar6,0x20), pcVar5 == (char *)0x0)) {
          pcVar6 = strstr(pcVar6,"\r\n");
          pAVar7 = &fl_XdndURIList;
          d3 = 0x1f;
          if (pcVar6 == (char *)0x0) goto LAB_001965c7;
        }
        else {
LAB_001965c7:
          pAVar7 = &fl_XaUtf8String;
          d3 = 0;
        }
        fl_sendClientMessage((Window)window_00,fl_XdndEnter,d0,(long)(iVar1 << 0x18),*pAVar7,d3,0);
        goto LAB_00196646;
      }
      iVar3 = 0;
LAB_0019668d:
      pFVar4 = (Fl_Window *)0x0;
    }
    wait(pvVar8);
  } while( true );
}

Assistant:

int Fl::dnd() {
  Fl_Window *source_fl_win = Fl::first_window();
  Fl::first_window()->cursor(FL_CURSOR_MOVE);
  Window source_window = fl_xid(Fl::first_window());
  fl_local_grab = grabfunc;
  Window target_window = 0;
  Fl_Window* local_window = 0;
  int dndversion = 4; int dest_x, dest_y;
  XSetSelectionOwner(fl_display, fl_XdndSelection, fl_message_window, fl_event_time);

  while (Fl::pushed()) {

    // figure out what window we are pointing at:
    Window new_window = 0; int new_version = 0;
    Fl_Window* new_local_window = 0;
    for (Window child = RootWindow(fl_display, fl_screen);;) {
      Window root; unsigned int junk3;
      XQueryPointer(fl_display, child, &root, &child,
		    &e_x_root, &e_y_root, &dest_x, &dest_y, &junk3);
      if (!child) {
	if (!new_window && (new_version = dnd_aware(root))) new_window = root;
	break;
      }
      new_window = child;
      if ((new_local_window = fl_find(child))) break;
      if ((new_version = dnd_aware(new_window))) break;
    }

    if (new_window != target_window) {
      if (local_window) {
	local_handle(FL_DND_LEAVE, local_window);
      } else if (dndversion) {
	fl_sendClientMessage(target_window, fl_XdndLeave, source_window);
      }
      dndversion = new_version;
      target_window = new_window;
      local_window = new_local_window;
      if (local_window) {
	local_handle(FL_DND_ENTER, local_window);
      } else if (dndversion) {
        // Send an X-DND message to the target window.  In order to
	// support dragging of files/URLs as well as arbitrary text,
	// we look at the selection buffer - if the buffer starts
	// with a common URI scheme, does not contain spaces, and
	// contains at least one CR LF, then we flag the data as
	// both a URI list (MIME media type "text/uri-list") and
	// plain text.  Otherwise, we just say it is plain text.
        if ((!strncmp(fl_selection_buffer[0], "file:///", 8) ||
	     !strncmp(fl_selection_buffer[0], "ftp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "http://", 7) ||
	     !strncmp(fl_selection_buffer[0], "https://", 8) ||
	     !strncmp(fl_selection_buffer[0], "ipp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "ldap:", 5) ||
	     !strncmp(fl_selection_buffer[0], "mailto:", 7) ||
	     !strncmp(fl_selection_buffer[0], "news:", 5) ||
	     !strncmp(fl_selection_buffer[0], "smb://", 6)) &&
	    !strchr(fl_selection_buffer[0], ' ') &&
	    strstr(fl_selection_buffer[0], "\r\n")) {
	  // Send file/URI list...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XdndURIList, XA_STRING, 0);
        } else {
	  // Send plain text...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XaUtf8String, 0, 0);
	}
      }
    }
    if (local_window) {
      local_handle(FL_DND_DRAG, local_window);
    } else if (dndversion) {
      fl_sendClientMessage(target_window, fl_XdndPosition, source_window,
			   0, (e_x_root<<16)|e_y_root, fl_event_time,
			   fl_XdndActionCopy);
    }
    Fl::wait();
  }

  if (local_window) {
    fl_i_own_selection[0] = 1;
    if (local_handle(FL_DND_RELEASE, local_window)) paste(*belowmouse(), 0);
  } else if (dndversion) {
    fl_sendClientMessage(target_window, fl_XdndDrop, source_window,
			 0, fl_event_time);
  } else if (target_window) {
    // fake a drop by clicking the middle mouse button:
    XButtonEvent msg;
    msg.type = ButtonPress;
    msg.window = target_window;
    msg.root = RootWindow(fl_display, fl_screen);
    msg.subwindow = 0;
    msg.time = fl_event_time+1;
    msg.x = dest_x;
    msg.y = dest_y;
    msg.x_root = Fl::e_x_root;
    msg.y_root = Fl::e_y_root;
    msg.state = 0x0;
    msg.button = Button2;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
    msg.time++;
    msg.state = 0x200;
    msg.type = ButtonRelease;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
  }

  fl_local_grab = 0;
  source_fl_win->cursor(FL_CURSOR_DEFAULT);
  return 1;
}